

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

any * __thiscall
nonstd::any_lite::any::operator=
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  placeholder *ppVar1;
  placeholder *in_RAX;
  any local_18;
  
  local_18.content = in_RAX;
  any<std::__cxx11::string>(&local_18,value);
  ppVar1 = this->content;
  this->content = (placeholder *)local_18;
  if (ppVar1 != (placeholder *)0x0) {
    local_18.content = ppVar1;
    (*ppVar1->_vptr_placeholder[1])();
  }
  return this;
}

Assistant:

any & operator=( ValueType const & value )
    {
        any( value ).swap( *this );
        return *this;
    }